

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<8,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  Type in0;
  float afStack_74 [5];
  int aiStack_60 [6];
  Matrix<float,_4,_4> local_48;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_48;
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_48.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_48.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_48.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_48.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_48.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_48.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_48.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_48.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    pfVar1 = (float *)&local_48;
    local_48.m_data.m_data[3].m_data[0] = 0.0;
    local_48.m_data.m_data[3].m_data[1] = 0.0;
    local_48.m_data.m_data[3].m_data[2] = 0.0;
    local_48.m_data.m_data[3].m_data[3] = 0.0;
    local_48.m_data.m_data[2].m_data[0] = 0.0;
    local_48.m_data.m_data[2].m_data[1] = 0.0;
    local_48.m_data.m_data[2].m_data[2] = 0.0;
    local_48.m_data.m_data[2].m_data[3] = 0.0;
    local_48.m_data.m_data[1].m_data[0] = 0.0;
    local_48.m_data.m_data[1].m_data[1] = 0.0;
    local_48.m_data.m_data[1].m_data[2] = 0.0;
    local_48.m_data.m_data[1].m_data[3] = 0.0;
    local_48.m_data.m_data[0].m_data[0] = 0.0;
    local_48.m_data.m_data[0].m_data[1] = 0.0;
    local_48.m_data.m_data[0].m_data[2] = 0.0;
    local_48.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &s_constInMat4x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = (float)*(undefined4 *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  afStack_74[2] = determinant<4>(&local_48);
  afStack_74[3] = afStack_74[2];
  afStack_74[4] = afStack_74[2];
  aiStack_60[2] = 0;
  aiStack_60[3] = 1;
  aiStack_60[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[aiStack_60[lVar2]] = afStack_74[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = Vec3(determinant(in0));
	}